

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::GetGlyphData(Font *font,int glyph_index,uint8_t **glyph_data,size_t *glyph_size)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  _Base_ptr *pp_Var7;
  uint uVar8;
  _Base_ptr p_Var9;
  ushort uVar10;
  ulong uVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Base_ptr *pp_Var14;
  _Base_ptr *pp_Var15;
  uint uVar16;
  bool bVar17;
  
  if (glyph_index < 0) {
    return false;
  }
  p_Var1 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
  p_Var13 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = p_Var13;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar17]) {
    bVar17 = p_Var9[1]._M_color < 0x68656164;
    if (!bVar17) {
      p_Var6 = p_Var9;
    }
  }
  p_Var9 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var9 = p_Var6, 0x68656164 < p_Var6[1]._M_color)) {
    p_Var9 = &p_Var1->_M_header;
  }
  p_Var6 = p_Var13;
  p_Var12 = &p_Var1->_M_header;
  pp_Var7 = (_Base_ptr *)0x0;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    pp_Var7 = &p_Var9[1]._M_parent;
  }
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[bVar17]) {
    bVar17 = p_Var6[1]._M_color < 0x6c6f6361;
    if (!bVar17) {
      p_Var12 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var12 != p_Var1) && (p_Var6 = p_Var12, 0x6c6f6361 < p_Var12[1]._M_color)
     ) {
    p_Var6 = &p_Var1->_M_header;
  }
  p_Var12 = &p_Var1->_M_header;
  pp_Var15 = (_Base_ptr *)0x0;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    pp_Var15 = &p_Var6[1]._M_parent;
  }
  for (; p_Var13 != (_Base_ptr)0x0; p_Var13 = (&p_Var13->_M_left)[bVar17]) {
    bVar17 = p_Var13[1]._M_color < 0x676c7966;
    if (!bVar17) {
      p_Var12 = p_Var13;
    }
  }
  p_Var13 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
     (p_Var13 = p_Var12, 0x676c7966 < p_Var12[1]._M_color)) {
    p_Var13 = &p_Var1->_M_header;
  }
  pp_Var14 = (_Base_ptr *)0x0;
  if ((_Rb_tree_header *)p_Var13 != p_Var1) {
    pp_Var14 = &p_Var13[1]._M_parent;
  }
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
    return false;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    return false;
  }
  if ((_Rb_tree_header *)p_Var13 == p_Var1) {
    return false;
  }
  if (0x33 < *(uint *)((long)pp_Var7 + 0xc)) {
    iVar3 = IndexFormat(font);
    p_Var9 = *(_Base_ptr *)((long)pp_Var15 + 0x10);
    uVar8 = *(uint *)((long)pp_Var15 + 0xc);
    uVar4 = (ulong)uVar8;
    if (iVar3 == 0) {
      uVar11 = (ulong)(uint)(glyph_index * 2);
      if (uVar8 < (uint)(glyph_index * 2) || 0x20000000 < (uint)glyph_index) {
        return false;
      }
      if ((((uVar11 + 2 <= uVar4) &&
           (uVar2 = *(ushort *)((long)&p_Var9->_M_color + uVar11), uVar2 = uVar2 << 8 | uVar2 >> 8,
           uVar11 + 4 <= uVar4)) &&
          (uVar10 = *(ushort *)((long)&p_Var9->_M_color + uVar11 + 2),
          uVar10 = uVar10 << 8 | uVar10 >> 8, uVar2 <= uVar10)) &&
         ((uint)uVar10 * 2 <= *(uint *)((long)pp_Var14 + 0xc))) {
        *glyph_data = (uint8_t *)((long)&pp_Var14[2]->_M_color + (ulong)((uint)uVar2 + (uint)uVar2))
        ;
        sVar5 = (size_t)(int)(((uint)uVar10 - (uint)uVar2) * 2);
LAB_00106ccb:
        *glyph_size = sVar5;
        return true;
      }
    }
    else {
      uVar16 = glyph_index << 2;
      uVar11 = (ulong)uVar16;
      if (uVar8 < uVar16 || 0x40000000 < uVar16) {
        return false;
      }
      if (uVar11 + 4 <= uVar4) {
        uVar8 = *(uint *)((long)&p_Var9->_M_color + uVar11);
        uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        if (uVar4 < uVar11 + 8) {
          return false;
        }
        uVar16 = *(uint *)(&p_Var9->field_0x4 + uVar11);
        uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18
        ;
        sVar5 = (size_t)(uVar16 - uVar8);
        if (uVar16 < uVar8) {
          return false;
        }
        if (uVar16 <= *(uint *)((long)pp_Var14 + 0xc)) {
          *glyph_data = (uint8_t *)((long)&pp_Var14[2]->_M_color + (ulong)uVar8);
          goto LAB_00106ccb;
        }
      }
    }
  }
  return false;
}

Assistant:

bool GetGlyphData(const Font& font, int glyph_index,
                  const uint8_t** glyph_data, size_t* glyph_size) {
  if (glyph_index < 0) {
    return FONT_COMPRESSION_FAILURE();
  }
  const Font::Table* head_table = font.FindTable(kHeadTableTag);
  const Font::Table* loca_table = font.FindTable(kLocaTableTag);
  const Font::Table* glyf_table = font.FindTable(kGlyfTableTag);
  if (head_table == NULL || loca_table == NULL || glyf_table == NULL ||
      head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }

  int index_fmt = IndexFormat(font);

  Buffer loca_buf(loca_table->data, loca_table->length);
  if (index_fmt == 0) {
    uint16_t offset1, offset2;
    if (!loca_buf.Skip(2 * glyph_index) ||
        !loca_buf.ReadU16(&offset1) ||
        !loca_buf.ReadU16(&offset2) ||
        offset2 < offset1 ||
        2 * offset2 > glyf_table->length) {
      return FONT_COMPRESSION_FAILURE();
    }
    *glyph_data = glyf_table->data + 2 * offset1;
    *glyph_size = 2 * (offset2 - offset1);
  } else {
    uint32_t offset1, offset2;
    if (!loca_buf.Skip(4 * glyph_index) ||
        !loca_buf.ReadU32(&offset1) ||
        !loca_buf.ReadU32(&offset2) ||
        offset2 < offset1 ||
        offset2 > glyf_table->length) {
      return FONT_COMPRESSION_FAILURE();
    }
    *glyph_data = glyf_table->data + offset1;
    *glyph_size = offset2 - offset1;
  }
  return true;
}